

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Schema *pSVar4;
  Schema *pSVar5;
  char *p;
  int iVar6;
  uint uVar7;
  Incrblob *p_00;
  Table *pTVar8;
  Index *pIVar9;
  Vdbe *p_01;
  VdbeOp *pVVar10;
  long lVar11;
  Schema **ppSVar12;
  sqlite3 *psVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  FKey *pFVar17;
  uint uVar18;
  Vdbe *v;
  char *pcVar19;
  int p1;
  char *zErr;
  Parse sParse;
  uint local_220;
  char *local_210;
  sqlite3 *local_208;
  int local_200;
  uint local_1fc;
  Table *local_1f8;
  Incrblob *local_1f0;
  sqlite_int64 local_1e8;
  char *local_1e0;
  char *local_1d8;
  Parse local_1d0;
  
  local_210 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_200 = wrFlag;
  local_1e8 = iRow;
  local_1e0 = zDb;
  local_1d8 = zTable;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p_00 = (Incrblob *)sqlite3DbMallocZero(db,0x38);
  uVar7 = 0;
  local_1fc = 0;
  local_208 = db;
  local_1f0 = p_00;
LAB_001528a3:
  local_220 = 0;
  memset(&local_1d0,0,0x1a0);
  if (p_00 != (Incrblob *)0x0) {
    local_1d0.db = db;
    if (local_210 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_210);
    }
    pcVar19 = local_1d8;
    local_210 = (char *)0x0;
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    pTVar8 = sqlite3LocateTable(&local_1d0,0,pcVar19,local_1e0);
    if (pTVar8 == (Table *)0x0) {
LAB_0015292f:
      pTVar8 = (Table *)0x0;
    }
    else if (pTVar8->nModuleArg != 0) {
      sqlite3ErrorMsg(&local_1d0,"cannot open virtual table: %s",pcVar19);
      goto LAB_0015292f;
    }
    if (pTVar8 == (Table *)0x0) {
LAB_00152952:
      pTVar8 = (Table *)0x0;
    }
    else if ((pTVar8->tabFlags & 0x20) != 0) {
      sqlite3ErrorMsg(&local_1d0,"cannot open table without rowid: %s",pcVar19);
      goto LAB_00152952;
    }
    if (pTVar8 == (Table *)0x0) {
LAB_00152976:
      pTVar8 = (Table *)0x0;
    }
    else if (pTVar8->pSelect != (Select *)0x0) {
      sqlite3ErrorMsg(&local_1d0,"cannot open view: %s",pcVar19);
      goto LAB_00152976;
    }
    psVar13 = local_208;
    if (pTVar8 != (Table *)0x0) {
      p_00->pTab = pTVar8;
      if (pTVar8->pSchema == (Schema *)0x0) {
        lVar11 = -1000000;
      }
      else {
        lVar11 = -0x100000000;
        ppSVar12 = &db->aDb->pSchema;
        do {
          lVar11 = lVar11 + 0x100000000;
          pSVar4 = *ppSVar12;
          ppSVar12 = ppSVar12 + 4;
        } while (pSVar4 != pTVar8->pSchema);
        lVar11 = lVar11 >> 0x20;
      }
      p_00->zDb = db->aDb[lVar11].zDbSName;
      uVar18 = (uint)pTVar8->nCol;
      if (0 < pTVar8->nCol) {
        uVar15 = 0;
LAB_001529e6:
        lVar11 = 0;
        do {
          bVar1 = pTVar8->aCol[uVar15].zName[lVar11];
          bVar2 = zColumn[lVar11];
          if (bVar1 == bVar2) {
            if ((ulong)bVar1 == 0) goto LAB_00152a18;
          }
          else if (""[bVar1] != ""[bVar2]) goto LAB_00152a18;
          lVar11 = lVar11 + 1;
        } while( true );
      }
      uVar15 = 0;
      goto LAB_00152a2c;
    }
    if (local_1d0.zErrMsg != (char *)0x0) {
      local_210 = local_1d0.zErrMsg;
      local_1d0.zErrMsg = (char *)0x0;
    }
    goto LAB_00152d67;
  }
LAB_00152d87:
  if ((local_220 == 0) && (db->mallocFailed == '\0')) {
    *ppBlob = (sqlite3_blob *)p_00;
  }
  else if (p_00 != (Incrblob *)0x0) {
    if ((Vdbe *)p_00->pStmt != (Vdbe *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)p_00->pStmt);
    }
    if (p_00 != (Incrblob *)0x0) {
      sqlite3DbFreeNN(db,p_00);
    }
  }
  p = local_210;
  pcVar19 = "%s";
  if (local_210 == (char *)0x0) {
    pcVar19 = (char *)0x0;
  }
  sqlite3ErrorWithMsg(db,local_220,pcVar19,local_210);
  if (p != (char *)0x0) {
    sqlite3DbFreeNN(db,p);
  }
  sqlite3ParserReset(&local_1d0);
  if ((local_220 == 0xc0a) || (db->mallocFailed != '\0')) {
    apiOomError(db);
    local_220 = 7;
  }
  else {
    local_220 = local_220 & db->errMask;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return local_220;
LAB_00152a18:
  if (bVar1 == bVar2) goto LAB_00152a2c;
  uVar15 = uVar15 + 1;
  if (uVar15 == uVar18) goto code_r0x00152a25;
  goto LAB_001529e6;
code_r0x00152a25:
  uVar15 = (ulong)uVar18;
LAB_00152a2c:
  uVar14 = (uint)uVar15;
  if (uVar14 == uVar18) {
    local_210 = sqlite3MPrintf(db,"no such column: \"%s\"",zColumn);
LAB_00152d67:
    local_220 = 1;
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
      local_220 = 1;
    }
    goto LAB_00152d87;
  }
  local_220 = uVar7;
  local_1f8 = pTVar8;
  if (local_200 != 0) {
    if (((db->flags & 0x4000) == 0) || (pFVar17 = pTVar8->pFKey, pFVar17 == (FKey *)0x0)) {
      pcVar19 = (char *)0x0;
    }
    else {
      pcVar19 = (char *)0x0;
      do {
        if (0 < (long)pFVar17->nCol) {
          lVar11 = 0;
          do {
            if (*(uint *)((long)&pFVar17->aCol[0].iFrom + lVar11) == uVar14) {
              pcVar19 = "foreign key";
            }
            lVar11 = lVar11 + 0x10;
          } while ((long)pFVar17->nCol * 0x10 != lVar11);
        }
        pFVar17 = pFVar17->pNextFrom;
      } while (pFVar17 != (FKey *)0x0);
    }
    for (pIVar9 = pTVar8->pIndex; pIVar9 != (Index *)0x0; pIVar9 = pIVar9->pNext) {
      if ((ulong)pIVar9->nKeyCol != 0) {
        uVar16 = 0;
        do {
          if (uVar14 == (int)pIVar9->aiColumn[uVar16]) {
            pcVar19 = "indexed";
          }
          if ((int)pIVar9->aiColumn[uVar16] == 0xfffffffe) {
            pcVar19 = "indexed";
          }
          uVar16 = uVar16 + 1;
        } while (pIVar9->nKeyCol != uVar16);
      }
    }
    if (pcVar19 != (char *)0x0) {
      local_210 = sqlite3MPrintf(local_208,"cannot open %s column for writing",pcVar19);
      uVar7 = 1;
      if (psVar13->noSharedCache == '\0') {
        btreeLeaveAll(psVar13);
        uVar7 = 1;
      }
    }
    db = local_208;
    p_00 = local_1f0;
    local_220 = uVar7;
    if (pcVar19 != (char *)0x0) goto LAB_00152d87;
  }
  p_01 = sqlite3VdbeCreate(&local_1d0);
  p_00->pStmt = (sqlite3_stmt *)p_01;
  if (p_01 != (Vdbe *)0x0) {
    pSVar4 = local_1f8->pSchema;
    if (pSVar4 == (Schema *)0x0) {
      p1 = -1000000;
    }
    else {
      p1 = -1;
      ppSVar12 = &local_208->aDb->pSchema;
      do {
        p1 = p1 + 1;
        pSVar5 = *ppSVar12;
        ppSVar12 = ppSVar12 + 4;
      } while (pSVar5 != pSVar4);
    }
    iVar3 = pSVar4->iGeneration;
    iVar6 = sqlite3VdbeAddOp3(p_01,2,p1,(uint)(wrFlag != 0),pSVar4->schema_cookie);
    psVar13 = p_01->db;
    if (psVar13->mallocFailed == '\0') {
      psVar13 = (sqlite3 *)p_01->aOp;
      *(undefined1 *)((long)psVar13->aLimit + (long)iVar6 * 0x18 + -0x7b) = 0xfd;
      psVar13->aLimit[(long)iVar6 * 6 + -0x1b] = iVar3;
    }
    if (0 < (long)p_01->nOp) {
      psVar13 = (sqlite3 *)p_01->aOp;
      *(undefined2 *)((long)psVar13 + ((long)p_01->nOp + -1) * 0x18 + 2) = 1;
    }
    pVVar10 = sqlite3VdbeAddOpList(p_01,6,sqlite3_blob_open::openBlob,(int)psVar13);
    uVar7 = 1 << ((byte)p1 & 0x1f);
    p_01->btreeMask = p_01->btreeMask | uVar7;
    if ((p1 != 1) && ((p_01->db->aDb[p1].pBt)->sharable != '\0')) {
      p_01->lockMask = p_01->lockMask | uVar7;
    }
    if (local_208->mallocFailed == '\0') {
      pVVar10->p1 = p1;
      pVVar10->p2 = local_1f8->tnum;
      pVVar10->p3 = (uint)(wrFlag != 0);
      sqlite3VdbeChangeP4(p_01,2,local_1f8->zName,0);
    }
    if (local_208->mallocFailed == '\0') {
      if (local_200 != 0) {
        pVVar10[1].opcode = 'm';
      }
      pVVar10[1].p2 = local_1f8->tnum;
      pVVar10[1].p3 = p1;
      pVVar10[1].p4type = -3;
      pVVar10[1].p4.i = local_1f8->nCol + 1;
      pVVar10[3].p2 = (int)local_1f8->nCol;
      local_1d0.nVar = 0;
      local_1d0.nTab = 1;
      local_1d0.nMem = 1;
      sqlite3VdbeMakeReady(p_01,&local_1d0);
    }
  }
  p_00 = local_1f0;
  db = local_208;
  local_1f0->iCol = (u16)uVar15;
  local_1f0->db = local_208;
  if (local_208->noSharedCache == '\0') {
    btreeLeaveAll(local_208);
  }
  if ((db->mallocFailed != '\0') ||
     (local_220 = blobSeekToRow(p_00,local_1e8,&local_210), 0x30 < local_1fc)) goto LAB_00152d87;
  local_1fc = local_1fc + 1;
  uVar7 = 0x11;
  if (local_220 != 0x11) goto LAB_00152d87;
  goto LAB_001528a3;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Incrblob *pBlob = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  do {
    memset(&sParse, 0, sizeof(Parse));
    if( !pBlob ) goto blob_open_out;
    sParse.db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(&sParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( sParse.zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = sParse.zErrMsg;
        sParse.zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(&sParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      
      /* This VDBE program seeks a btree cursor to the identified 
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and 
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the 
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);
      assert( sqlite3VdbeCurrentAddr(v)==2 || db->mallocFailed );
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;   

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type 
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        sParse.nVar = 0;
        sParse.nMem = 1;
        sParse.nTab = 1;
        sqlite3VdbeMakeReady(v, &sParse);
      }
    }
   
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}